

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void mnf::utils::hat2(Matrix3d *M,Vector3d *v)

{
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar1;
  double v2v0;
  double v1v2;
  double v0v1;
  double local_78;
  double local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  double local_50;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_48;
  double local_28;
  undefined8 uStack_20;
  double local_10;
  double local_8;
  
  local_68 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[0];
  local_28 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[1];
  local_50 = local_68 * local_28;
  local_58 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
  local_70 = local_28 * local_58;
  uStack_60 = 0;
  local_78 = local_68 * local_58;
  local_28 = local_28 * local_28;
  local_58 = local_58 * local_58;
  uStack_20 = 0;
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       -local_28 - local_58;
  local_48.m_xpr = M;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_48,&local_50);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_78);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_50);
  uStack_60 = uStack_60 ^ 0x8000000000000000;
  local_68 = -local_68 * local_68;
  local_8 = local_68 - local_58;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_8);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_70);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_78);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_70);
  local_10 = local_68 - local_28;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_10);
  if ((local_48.m_currentBlockRows + local_48.m_row == 3) && (local_48.m_col == 3)) {
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
               );
}

Assistant:

void hat2(Eigen::Matrix3d& M, const Eigen::Vector3d& v)
{
  double v0v1 = v(0) * v(1);
  double v1v2 = v(1) * v(2);
  double v2v0 = v(2) * v(0);
  double v0_2 = v(0) * v(0);
  double v1_2 = v(1) * v(1);
  double v2_2 = v(2) * v(2);

  M << -v1_2 - v2_2, v0v1, v2v0, v0v1, -v0_2 - v2_2, v1v2, v2v0, v1v2,
      -v0_2 - v1_2;
}